

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint32_t helper_vfp_touhh_arm(uint32_t x,uint32_t shift,void *fpst)

{
  uint16_t uVar1;
  int iVar2;
  void *fpst_local;
  uint32_t shift_local;
  uint32_t x_local;
  
  iVar2 = float16_is_any_nan((float16)x);
  if (iVar2 == 0) {
    iVar2 = get_float_rounding_mode((float_status *)fpst);
    uVar1 = float16_to_uint16_scalbn_arm((float16)x,iVar2,shift,(float_status *)fpst);
    shift_local = (uint32_t)uVar1;
  }
  else {
    float_raise_arm('\x01',(float_status *)fpst);
    shift_local = 0;
  }
  return shift_local;
}

Assistant:

uint32_t HELPER(vfp_touhh)(uint32_t x, uint32_t shift, void *fpst)
{
    if (unlikely(float16_is_any_nan(x))) {
        float_raise(float_flag_invalid, fpst);
        return 0;
    }
    return float16_to_uint16_scalbn(x, get_float_rounding_mode(fpst),
                                    shift, fpst);
}